

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O1

void Llb_MtrAddColumn(Llb_Mtr_t *p,Llb_Grp_t *pGrp)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  
  lVar3 = (long)pGrp->Id;
  if ((lVar3 < 0) || (p->nCols <= pGrp->Id)) {
    __assert_fail("iCol >= 0 && iCol < p->nCols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Matrix.c"
                  ,0x15e,"void Llb_MtrAddColumn(Llb_Mtr_t *, Llb_Grp_t *)");
  }
  p->pColGrps[lVar3] = pGrp;
  pVVar6 = pGrp->vIns;
  if (0 < pVVar6->nSize) {
    lVar4 = 0;
    do {
      iVar1 = *(int *)((long)pVVar6->pArray[lVar4] + 0x24);
      if (((long)iVar1 < 0) || (pVVar2 = pGrp->pMan->vObj2Var, pVVar2->nSize <= iVar1))
      goto LAB_0081b003;
      iVar1 = pVVar2->pArray[iVar1];
      lVar5 = (long)iVar1;
      if ((lVar5 < 0) || (p->nRows <= iVar1)) {
        __assert_fail("iRow >= 0 && iRow < p->nRows",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Matrix.c"
                      ,0x163,"void Llb_MtrAddColumn(Llb_Mtr_t *, Llb_Grp_t *)");
      }
      p->pMatrix[lVar3][lVar5] = '\x01';
      p->pColSums[lVar3] = p->pColSums[lVar3] + 1;
      p->pRowSums[lVar5] = p->pRowSums[lVar5] + 1;
      lVar4 = lVar4 + 1;
      pVVar6 = pGrp->vIns;
    } while (lVar4 < pVVar6->nSize);
  }
  pVVar6 = pGrp->vOuts;
  if (0 < pVVar6->nSize) {
    lVar4 = 0;
    do {
      iVar1 = *(int *)((long)pVVar6->pArray[lVar4] + 0x24);
      if (((long)iVar1 < 0) || (pVVar2 = pGrp->pMan->vObj2Var, pVVar2->nSize <= iVar1)) {
LAB_0081b003:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pVVar2->pArray[iVar1];
      lVar5 = (long)iVar1;
      if ((lVar5 < 0) || (p->nRows <= iVar1)) {
        __assert_fail("iRow >= 0 && iRow < p->nRows",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Matrix.c"
                      ,0x16b,"void Llb_MtrAddColumn(Llb_Mtr_t *, Llb_Grp_t *)");
      }
      p->pMatrix[lVar3][lVar5] = '\x01';
      p->pColSums[lVar3] = p->pColSums[lVar3] + 1;
      p->pRowSums[lVar5] = p->pRowSums[lVar5] + 1;
      lVar4 = lVar4 + 1;
      pVVar6 = pGrp->vOuts;
    } while (lVar4 < pVVar6->nSize);
  }
  return;
}

Assistant:

void Llb_MtrAddColumn( Llb_Mtr_t * p, Llb_Grp_t * pGrp )
{
    Aig_Obj_t * pVar;
    int i, iRow, iCol = pGrp->Id;
    assert( iCol >= 0 && iCol < p->nCols );
    p->pColGrps[iCol] = pGrp;
    Vec_PtrForEachEntry( Aig_Obj_t *, pGrp->vIns, pVar, i )
    {
        iRow = Vec_IntEntry( pGrp->pMan->vObj2Var, Aig_ObjId(pVar) );
        assert( iRow >= 0 && iRow < p->nRows );
        p->pMatrix[iCol][iRow] = 1;
        p->pColSums[iCol]++;
        p->pRowSums[iRow]++;
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGrp->vOuts, pVar, i )
    {
        iRow = Vec_IntEntry( pGrp->pMan->vObj2Var, Aig_ObjId(pVar) );
        assert( iRow >= 0 && iRow < p->nRows );
        p->pMatrix[iCol][iRow] = 1;
        p->pColSums[iCol]++;
        p->pRowSums[iRow]++;
    }
}